

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chunk_info.cpp
# Opt level: O2

void __thiscall
duckdb::ChunkVectorInfo::CommitAppend
          (ChunkVectorInfo *this,transaction_t commit_id,idx_t start,idx_t end)

{
  if (this->same_inserted_id == true) {
    this->insert_id = commit_id;
  }
  for (; start < end; start = start + 1) {
    this->inserted[start] = commit_id;
  }
  return;
}

Assistant:

void ChunkVectorInfo::CommitAppend(transaction_t commit_id, idx_t start, idx_t end) {
	if (same_inserted_id) {
		insert_id = commit_id;
	}
	for (idx_t i = start; i < end; i++) {
		inserted[i] = commit_id;
	}
}